

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<3,_Fad<float>_>::TPZFNMatrix
          (TPZFNMatrix<3,_Fad<float>_> *this,int64_t row,int64_t col,Fad<float> *val)

{
  Fad<float> *buf;
  long lVar1;
  Fad<float> FStack_48;
  
  (this->super_TPZFMatrix<Fad<float>_>).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016839c8;
  buf = this->fBuf;
  TPZFMatrix<Fad<float>_>::TPZFMatrix
            (&this->super_TPZFMatrix<Fad<float>_>,&PTR_PTR_01683c80,row,col,buf,3);
  (this->super_TPZFMatrix<Fad<float>_>).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016839c8;
  lVar1 = 0;
  do {
    Fad<float>::Fad(buf);
    lVar1 = lVar1 + -0x20;
    buf = buf + 1;
  } while (lVar1 != -0x80);
  Fad<float>::Fad(&FStack_48,val);
  TPZFMatrix<Fad<float>_>::operator=(&this->super_TPZFMatrix<Fad<float>_>,&FStack_48);
  Fad<float>::~Fad(&FStack_48);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }